

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O2

int Dar_CutFilter(Aig_Obj_t *pObj,Dar_Cut_t *pCut)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Dar_Cut_t *pDom;
  
  if ((pCut->field_0x7 & 0x10) == 0) {
    __assert_fail("pCut->fUsed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darCut.c"
                  ,0xdd,"int Dar_CutFilter(Aig_Obj_t *, Dar_Cut_t *)");
  }
  pDom = (Dar_Cut_t *)(pObj->field_5).pData;
  uVar3 = 0;
  do {
    if ((byte)pObj->field_0x1f <= uVar3) {
      return 0;
    }
    if (pDom != pCut && (*(uint *)&pDom->field_0x4 >> 0x1c & 1) != 0) {
      uVar2 = pCut->uSign & pDom->uSign;
      if (*(uint *)&pCut->field_0x4 >> 0x1d < *(uint *)&pDom->field_0x4 >> 0x1d) {
        if ((uVar2 == pCut->uSign) && (iVar1 = Dar_CutCheckDominance(pCut,pDom), iVar1 != 0)) {
          pDom->field_0x7 = pDom->field_0x7 & 0xef;
        }
      }
      else if ((uVar2 == pDom->uSign) && (iVar1 = Dar_CutCheckDominance(pDom,pCut), iVar1 != 0)) {
        pCut->field_0x7 = pCut->field_0x7 & 0xef;
        return 1;
      }
    }
    uVar3 = uVar3 + 1;
    pDom = pDom + 1;
  } while( true );
}

Assistant:

static inline int Dar_CutFilter( Aig_Obj_t * pObj, Dar_Cut_t * pCut )
{ 
    Dar_Cut_t * pTemp;
    int i;
    assert( pCut->fUsed );
    // go through the cuts of the node
    Dar_ObjForEachCut( pObj, pTemp, i )
    {
        if ( pTemp == pCut )
            continue;
        if ( pTemp->nLeaves > pCut->nLeaves )
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
                continue;
            // check containment seriously
            if ( Dar_CutCheckDominance( pCut, pTemp ) )
            {
                // remove contained cut
                pTemp->fUsed = 0;
            }
         }
        else
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
                continue;
            // check containment seriously
            if ( Dar_CutCheckDominance( pTemp, pCut ) )
            {
                // remove the given cut
                pCut->fUsed = 0;
                return 1;
            }
        }
    }
    return 0;
}